

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrappedValue.cpp
# Opt level: O1

QString * __thiscall WrappedValue::toQString(QString *__return_storage_ptr__,WrappedValue *this)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  uint64_t uVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  bool isOk;
  QVariant val;
  bool local_a1;
  undefined1 local_a0 [32];
  QArrayData *local_80;
  char16_t *local_78;
  qsizetype local_70;
  QArrayData *local_68;
  undefined8 *local_60;
  long local_58;
  QArrayData *local_50 [3];
  anon_union_24_3_e3d07ef4_for_data local_38;
  
  if (this->m_Type == COMPLEX) {
    QVar6.m_data = (storage_type *)0x3;
    QVar6.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar6);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = (Data *)local_38.shared;
  }
  else {
    if (this->m_Type != NONE) {
      getQVariant((QVariant *)&local_38,this);
      if (this->m_Type - STRING < 2) {
        QVariant::toString();
      }
      else if (this->m_Type == INT) {
        if (this->m_Size < 9) {
          local_a1 = false;
          uVar4 = AbstractByteBuffer::getNumValue
                            (this->m_Owner,this->m_Offset,this->m_Size,&local_a1);
          if (local_a1 != false) {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
            (__return_storage_ptr__->d).size = 0;
            (**this->_vptr_WrappedValue)(local_50,this);
            QString::toUtf8_helper((QString *)&local_68);
            if (local_60 == (undefined8 *)0x0) {
              local_60 = &QByteArray::_empty;
            }
            local_a0._0_8_ = (PrivateShared *)(local_a0 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a0,local_60,(long)local_60 + local_58);
            if (local_68 != (QArrayData *)0x0) {
              LOCK();
              (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_68,1,8);
              }
            }
            QString::asprintf((char *)&local_80,local_a0._0_8_,uVar4);
            pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
            (__return_storage_ptr__->d).d = (Data *)local_80;
            pcVar3 = (__return_storage_ptr__->d).ptr;
            (__return_storage_ptr__->d).ptr = local_78;
            qVar2 = (__return_storage_ptr__->d).size;
            (__return_storage_ptr__->d).size = local_70;
            local_80 = pQVar1;
            local_78 = pcVar3;
            local_70 = qVar2;
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar1,2,8);
              }
            }
            if ((PrivateShared *)local_a0._0_8_ != (PrivateShared *)(local_a0 + 0x10)) {
              operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
            }
            if (local_50[0] != (QArrayData *)0x0) {
              LOCK();
              (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_50[0],2,8);
              }
            }
            goto LAB_0012075a;
          }
          QVar8.m_data = (storage_type *)0x7;
          QVar8.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar8);
        }
        else {
          QVar7.m_data = (storage_type *)0x3;
          QVar7.m_size = (qsizetype)local_a0;
          QString::fromUtf8(QVar7);
        }
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        (__return_storage_ptr__->d).d = (Data *)local_a0._0_8_;
        local_a0._0_8_ = (PrivateShared *)0x0;
        pcVar3 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_a0._8_8_;
        (__return_storage_ptr__->d).size = local_a0._16_8_;
        local_a0._8_8_ = pcVar3;
      }
      else {
        getQVariant((QVariant *)local_a0,this);
        QVariant::toString();
        QVariant::~QVariant((QVariant *)local_a0);
      }
LAB_0012075a:
      QVariant::~QVariant((QVariant *)&local_38);
      return __return_storage_ptr__;
    }
    QVar5.m_data = (storage_type *)0x0;
    QVar5.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar5);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = (Data *)local_38.shared;
  }
  (__return_storage_ptr__->d).ptr = (char16_t *)local_38._8_8_;
  (__return_storage_ptr__->d).size = local_38._16_8_;
  return __return_storage_ptr__;
}

Assistant:

QString WrappedValue::toQString()
{
    if (this->m_Type == NONE) return "";
    if (this->m_Type == COMPLEX) return "...";

    QVariant val = getQVariant();

    if (this->m_Type == STRING || this->m_Type == WSTRING) {
        return val.toString();
    }
    if (this->m_Type == INT) {

        bufsize_t size = this->m_Size;
        if (size > sizeof(uint64_t)) return  "...";

        bool isOk = false;
        uint64_t num = m_Owner->getNumValue(m_Offset, m_Size, &isOk);
        if (!isOk) return "INVALID";
        QString out;
#if QT_VERSION >= 0x050000
        out = QString::asprintf(getIntFormat().toStdString().c_str(), num);
#else
        out.sprintf(getIntFormat().toStdString().c_str(), num);
#endif
        return out;
    }
    return getQVariant().toString();
}